

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Buffer.cpp
# Opt level: O0

char __thiscall Buffer::consume(Buffer *this,char c)

{
  undefined1 uVar1;
  bool bVar2;
  byte bVar3;
  char *pcVar4;
  anon_class_16_2_fd512dd0 __p;
  int local_5c;
  int i;
  undefined4 local_50;
  char *condition;
  undefined1 local_28 [6];
  bool isFirstElementOther;
  bool lessThan3Elements;
  unique_lock<std::mutex> lock;
  char c_local;
  Buffer *this_local;
  
  lock._15_1_ = c;
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)local_28,&this->mutex);
  bVar2 = isMoreThan3Elements(this);
  bVar3 = (bVar2 ^ 0xffU) & 1;
  bVar2 = isFirstElement(this,lock._15_1_);
  if ((bVar3 == 0) && (((bVar2 ^ 0xffU) & 1) == 0)) {
    printf("Consumer %c consumes\n",(ulong)(uint)(int)(char)lock._15_1_);
  }
  else {
    pcVar4 = "First element is other";
    if (bVar3 != 0) {
      pcVar4 = "Less than 3 elements";
    }
    printf("Consumer %c waits (%s)\n",(ulong)(uint)(int)(char)lock._15_1_,pcVar4);
    local_50 = CONCAT31(local_50._1_3_,lock._15_1_);
    __p._8_4_ = local_50;
    __p.this = this;
    __p._12_4_ = 0;
    std::condition_variable::wait<Buffer::consume(char)::__0>
              (&this->cond,(unique_lock<std::mutex> *)local_28,__p);
    printf("Consumer %c consumes after waiting (%s)\n",(ulong)(uint)(int)(char)lock._15_1_,pcVar4);
  }
  for (local_5c = 0; local_5c < this->position + -1; local_5c = local_5c + 1) {
    this->buffer[local_5c] = this->buffer[local_5c + 1];
  }
  this->position = this->position + -1;
  printBuffer(this);
  std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)local_28);
  std::condition_variable::notify_all();
  uVar1 = lock._15_1_;
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_28);
  return uVar1;
}

Assistant:

char Buffer::consume(char c) {
    std::unique_lock<std::mutex> lock(mutex);

    const bool lessThan3Elements = !isMoreThan3Elements();
    const bool isFirstElementOther = !isFirstElement(c);
    if (lessThan3Elements || isFirstElementOther) {
        const char *const condition = lessThan3Elements ? LESS_THAN_3_ELEMENTS : FIRST_ELEMENT_OTHER;
        printf("Consumer %c waits (%s)\n", c, condition);

        cond.wait(lock, [this, c]() -> bool { return isMoreThan3Elements() && isFirstElement(c); });

        printf("Consumer %c consumes after waiting (%s)\n", c, condition);
    } else {
        printf("Consumer %c consumes\n", c);
    }

    for (int i = 0; i < position - 1; ++i) {
        buffer[i] = buffer[i + 1];
    }
    --position;
    printBuffer();

    lock.unlock();
    cond.notify_all();
    return c;
}